

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitNew(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  int iVar1;
  ParseNode *pnode_00;
  code *pcVar2;
  ByteCodeGenerator *pBVar3;
  bool bVar4;
  ArgSlot givenArgCount;
  ProfileId PVar5;
  ProfileId callSiteId;
  uint uVar6;
  uint32 byteCount;
  RegSlot RVar7;
  ParseNodeCall *pPVar8;
  undefined4 *puVar9;
  ArgSlot ArgCount;
  ByteCodeWriter *this;
  uint argCount;
  uint uVar10;
  FuncInfo *funcInfo_00;
  BOOL local_64;
  FuncInfo *pFStack_60;
  BOOL fSideEffectArgs;
  AuxArray<unsigned_int> *local_58;
  AuxArray<unsigned_int> *spreadIndices;
  uint local_44;
  ByteCodeGenerator *local_40;
  int local_34;
  
  pFStack_60 = funcInfo;
  local_40 = byteCodeGenerator;
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  iVar1 = *(int *)&pPVar8->argCount;
  uVar10 = iVar1 + 1;
  local_64 = 0;
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  uVar6 = CountArguments(pPVar8->pnodeArgs,&local_64);
  spreadIndices = (AuxArray<unsigned_int> *)(ulong)(ushort)uVar10;
  argCount = uVar10 & 0xffff;
  local_44 = uVar10;
  if (uVar6 != (uVar10 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x20d1,"(argCount == tmpCount)",
                       "argCount cannot overflow as max args capped at parser level");
    if (!bVar4) goto LAB_0076b2e9;
    *puVar9 = 0;
    argCount = (uint)spreadIndices;
  }
  ByteCodeGenerator::StartStatement(local_40,pnode);
  funcInfo_00 = pFStack_60;
  FuncInfo::StartRecordingOutArgs(pFStack_60,argCount);
  if (local_64 != 0) {
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    SaveOpndValue(pPVar8->pnodeTarget,funcInfo_00);
  }
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  pBVar3 = local_40;
  Emit(pPVar8->pnodeTarget,local_40,funcInfo_00,0,true,false);
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  if (pPVar8->pnodeArgs == (ParseNodePtr)0x0) {
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo_00,pPVar8->pnodeTarget);
    bVar4 = CreateNativeArrays(pBVar3,funcInfo_00);
    uVar10 = 0xc4;
    if (bVar4) {
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = CallTargetIsArray(pPVar8->pnodeTarget);
      uVar10 = (uint)bVar4 * 3 + 0xc4;
    }
    if ((short)iVar1 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x20e7,"(argCount == 1)","argCount == 1");
      if (!bVar4) goto LAB_0076b2e9;
      *puVar9 = 0;
    }
    pBVar3 = local_40;
    local_44 = uVar10;
    PVar5 = ByteCodeGenerator::GetNextCallSiteId(local_40,(OpCode)uVar10);
    local_34 = CONCAT22(local_34._2_2_,PVar5);
    ArgCount = (ArgSlot)spreadIndices;
    Js::ByteCodeWriter::StartCall(&pBVar3->m_writer,StartCall,ArgCount);
    funcInfo_00 = pFStack_60;
    RVar7 = FuncInfo::AcquireLoc(pFStack_60,pnode);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::CallI
              (&pBVar3->m_writer,(OpCode)local_44,RVar7,pPVar8->pnodeTarget->location,ArgCount,
               (ProfileId)local_34,CallFlags_None);
    goto LAB_0076b2cf;
  }
  bVar4 = IsCallOfConstants(pnode);
  pBVar3 = local_40;
  if (bVar4) {
    Js::ByteCodeWriter::StartCall(&local_40->m_writer,StartCall,(ArgSlot)argCount);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo_00,pPVar8->pnodeTarget);
    givenArgCount = EmitNewObjectOfConstants(pnode,pBVar3,funcInfo_00,argCount);
  }
  else {
    bVar4 = CreateNativeArrays(local_40,funcInfo_00);
    if (bVar4) {
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = CallTargetIsArray(pPVar8->pnodeTarget);
      if (!bVar4) goto LAB_0076b071;
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      local_34 = (uint)(pPVar8->spreadArgCount != 0) * 2 + 199;
    }
    else {
LAB_0076b071:
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      local_34 = 0x160;
      if (pPVar8->spreadArgCount == 0) {
        local_34 = 0xc4;
      }
    }
    callSiteId = ByteCodeGenerator::GetNextCallSiteId(pBVar3,(OpCode)local_34);
    PVar5 = pBVar3->m_callSiteId;
    local_58 = (AuxArray<unsigned_int> *)0x0;
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    bVar4 = true;
    if ((pPVar8->field_0x24 & 0x10) == 0) {
      bVar4 = Js::FunctionProxy::IsCoroutine(&funcInfo_00->byteCodeFunction->super_FunctionProxy);
      if (bVar4) {
        pPVar8 = ParseNode::AsParseNodeCall(pnode);
        bVar4 = pPVar8->pnodeArgs != (ParseNodePtr)0x0;
      }
      else {
        bVar4 = false;
      }
    }
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    pnode_00 = pPVar8->pnodeArgs;
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    pBVar3 = local_40;
    funcInfo_00 = pFStack_60;
    givenArgCount =
         EmitArgList(pnode_00,0xffffffff,0xffffffff,0,1,local_40,pFStack_60,callSiteId,
                     (ArgSlot)spreadIndices,bVar4,callSiteId != PVar5,pPVar8->spreadArgCount,
                     &local_58);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo_00,pPVar8->pnodeTarget);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    if (pPVar8->spreadArgCount == 0) {
      RVar7 = FuncInfo::AcquireLoc(funcInfo_00,pnode);
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallI
                (&pBVar3->m_writer,(OpCode)local_34,RVar7,pPVar8->pnodeTarget->location,
                 givenArgCount,callSiteId,CallFlags_None);
    }
    else {
      if (local_58 == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2114,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar4) goto LAB_0076b2e9;
        *puVar9 = 0;
      }
      if (0x3fffffff < local_58->count) {
        Math::DefaultOverflowPolicy();
      }
      byteCount = UInt32Math::Add(4,local_58->count << 2);
      this = &local_40->m_writer;
      RVar7 = FuncInfo::AcquireLoc(funcInfo_00,pnode);
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallIExtended
                (this,(OpCode)local_34,RVar7,pPVar8->pnodeTarget->location,givenArgCount,
                 CallIExtended_SpreadArgs,local_58,byteCount,callSiteId,CallFlags_None);
    }
  }
  ArgCount = (ArgSlot)spreadIndices;
  if ((ArgSlot)local_44 != givenArgCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2122,"(argCount == actualArgCount)","argCount == actualArgCount");
    if (!bVar4) {
LAB_0076b2e9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
LAB_0076b2cf:
  FuncInfo::EndRecordingOutArgs(funcInfo_00,ArgCount);
  return;
}

Assistant:

void EmitNew(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
    argCount++; // include "this"

    BOOL fSideEffectArgs = FALSE;
    unsigned int tmpCount = CountArguments(pnode->AsParseNodeCall()->pnodeArgs, &fSideEffectArgs);
    AssertOrFailFastMsg(argCount == tmpCount, "argCount cannot overflow as max args capped at parser level");

    byteCodeGenerator->StartStatement(pnode);

    // Start call, allocate out param space
    funcInfo->StartRecordingOutArgs(argCount);

    // Assign the call target operand(s), putting them into expression temps if necessary to protect
    // them from side-effects.
    if (fSideEffectArgs)
    {
        SaveOpndValue(pnode->AsParseNodeCall()->pnodeTarget, funcInfo);
    }

    Emit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo, false, true);

    if (pnode->AsParseNodeCall()->pnodeArgs == nullptr)
    {
        funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
        Js::OpCode op = (CreateNativeArrays(byteCodeGenerator, funcInfo)
            && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget))
            ? Js::OpCode::NewScObjArray : Js::OpCode::NewScObject;
        Assert(argCount == 1);

        Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
        byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode),
            pnode->AsParseNodeCall()->pnodeTarget->location, argCount, callSiteId);
    }
    else
    {
        uint32 actualArgCount = 0;

        if (IsCallOfConstants(pnode))
        {
            byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
            actualArgCount = EmitNewObjectOfConstants(pnode, byteCodeGenerator, funcInfo, argCount);
        }
        else
        {
            Js::OpCode op;
            if ((CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget)))
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjArraySpread : Js::OpCode::NewScObjArray;
            }
            else
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            }

            Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);

            // Only emit profiled argouts if we're going to profile this call.
            bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

            Js::AuxArray<uint32> *spreadIndices = nullptr;

            // Emit argouts at end for generators so that we don't need to restore them when bailing in
            bool emitArgOutsAtEnd = pnode->AsParseNodeCall()->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnode->AsParseNodeCall()->pnodeArgs != nullptr);
            actualArgCount = EmitArgList(pnode->AsParseNodeCall()->pnodeArgs, Js::Constants::NoRegister, Js::Constants::NoRegister,
                false, true, byteCodeGenerator, funcInfo, callSiteId, argCount, emitArgOutsAtEnd, emitProfiledArgouts, pnode->AsParseNodeCall()->spreadArgCount, &spreadIndices);

            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);

            if (pnode->AsParseNodeCall()->spreadArgCount > 0)
            {
                Assert(spreadIndices != nullptr);
                uint spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
                uint spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
                byteCodeGenerator->Writer()->CallIExtended(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, Js::CallIExtended_SpreadArgs,
                    spreadIndices, spreadIndicesSize, callSiteId);
            }
            else
            {
                byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, callSiteId);
            }
        }

        Assert(argCount == actualArgCount);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs(argCount);
    return;
}